

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  Node **ppNVar1;
  Node *pNVar2;
  ctmbstr s1;
  ctmbstr s2;
  bool bVar3;
  byte bVar4;
  Bool BVar5;
  int iVar6;
  uint uVar7;
  AttVal *av;
  AttVal *attr;
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    pNVar2 = node->next;
    BVar5 = prvTidyIsAnchorElement(doc,node);
    if (BVar5 != no) {
      av = prvTidyAttrGetById(node,TidyAttr_NAME);
      attr = prvTidyAttrGetById(node,TidyAttr_ID);
      if (attr != (AttVal *)0x0 && av != (AttVal *)0x0) {
        s1 = av->value;
        s2 = attr->value;
        if ((s2 != (ctmbstr)0x0) == (s1 != (ctmbstr)0x0)) {
          if (s1 != (ctmbstr)0x0 && s2 != (ctmbstr)0x0) {
            iVar6 = prvTidytmbstrcmp(s1,s2);
            if (iVar6 != 0) goto LAB_0014ef8a;
          }
        }
        else {
LAB_0014ef8a:
          prvTidyReportAttrError(doc,node,av,0x242);
        }
        goto LAB_0014f042;
      }
      if (wantId == no || av == (AttVal *)0x0) {
        if (wantName == no || attr == (AttVal *)0x0) {
LAB_0014f042:
          bVar3 = false;
        }
        else {
          uVar7 = prvTidyNodeAttributeVersions(node,TidyAttr_NAME);
          if ((doc->lexer->versionEmitted & uVar7) == 0) goto LAB_0014f042;
          prvTidyRepairAttrValue(doc,node,"name",attr->value);
          bVar3 = true;
        }
        if (attr != (AttVal *)0x0 && wantId == no) {
          if ((wantName != no) && (av == (AttVal *)0x0 && !bVar3)) goto LAB_0014f0fa;
          if (wantName == no) {
            prvTidyRemoveAnchorByNode(doc,attr->value,node);
          }
          prvTidyRemoveAttribute(doc,node,attr);
          bVar3 = false;
          goto LAB_0014f0b0;
        }
        bVar4 = 0;
        bVar3 = wantId != no;
      }
      else {
        uVar7 = prvTidyNodeAttributeVersions(node,TidyAttr_ID);
        bVar3 = true;
        if ((doc->lexer->versionEmitted & uVar7) != 0) {
          BVar5 = prvTidyIsValidHTMLID(av->value);
          if (BVar5 != no) {
            prvTidyRepairAttrValue(doc,node,anon_var_dwarf_50c0f + 0x2b,av->value);
            bVar3 = true;
            bVar4 = 1;
            goto LAB_0014f0b2;
          }
          prvTidyReportAttrError(doc,node,av,0x24d);
        }
LAB_0014f0b0:
        bVar4 = 0;
      }
LAB_0014f0b2:
      if ((av != (AttVal *)0x0 && wantName == no) &&
         (!(bool)(attr == (AttVal *)0x0 & ((bVar4 | bVar3 ^ 1U) ^ 1)))) {
        if (!bVar3) {
          prvTidyRemoveAnchorByNode(doc,av->value,node);
        }
        prvTidyRemoveAttribute(doc,node,av);
      }
    }
LAB_0014f0fa:
    ppNVar1 = &node->content;
    node = pNVar2;
    if (*ppNVar1 != (Node *)0x0) {
      prvTidyFixAnchors(doc,*ppNVar1,wantName,wantId);
    }
  } while( true );
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
            TY_(FixAnchors)(doc, node->content, wantName, wantId);

        node = next;
    }
}